

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f *pFilm,Point2f *lensSample,Float *sampleBoundsArea)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Bounds2<float> *pBVar7;
  size_t sVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  Point3f PVar17;
  
  auVar16 = in_ZMM2._0_16_;
  fVar13 = (pFilm->super_Tuple2<pbrt::Point2,_float>).y;
  auVar15 = ZEXT416((uint)(pFilm->super_Tuple2<pbrt::Point2,_float>).x);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar13)),auVar15,auVar15);
  if (auVar15._0_4_ < 0.0) {
    fVar13 = sqrtf(auVar15._0_4_);
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar13 = auVar15._0_4_;
  }
  pBVar7 = (this->exitPupilBounds).ptr;
  sVar8 = (this->exitPupilBounds).nStored;
  auVar15 = vcvtusi2ss_avx512f(auVar16,sVar8);
  iVar12 = (int)((fVar13 / (*(float *)(((this->super_CameraBase).film.
                                        super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                       0xffffffffffff) + 0x20) * 0.5)) * auVar15._0_4_);
  iVar11 = (int)sVar8 + -1;
  if (iVar12 <= iVar11) {
    iVar11 = iVar12;
  }
  fVar1 = pBVar7[iVar11].pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fVar2 = pBVar7[iVar11].pMin.super_Tuple2<pbrt::Point2,_float>.y;
  fVar3 = pBVar7[iVar11].pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fVar4 = pBVar7[iVar11].pMax.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampleBoundsArea != (Float *)0x0) {
    *sampleBoundsArea = (fVar3 - fVar1) * (fVar4 - fVar2);
  }
  fVar5 = (lensSample->super_Tuple2<pbrt::Point2,_float>).x;
  fVar6 = (lensSample->super_Tuple2<pbrt::Point2,_float>).y;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(1.0 - fVar5)),
                            ZEXT416((uint)(fVar3 * fVar5)));
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(1.0 - fVar6)),
                            ZEXT416((uint)(fVar4 * fVar6)));
  bVar9 = fVar13 != 0.0;
  fVar1 = (float)((uint)bVar9 * (int)((pFilm->super_Tuple2<pbrt::Point2,_float>).y / fVar13));
  auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar14._0_4_ = fVar1;
  fVar13 = (float)((uint)bVar9 * (int)((pFilm->super_Tuple2<pbrt::Point2,_float>).x / fVar13) +
                  (uint)!bVar9 * 0x3f800000);
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(auVar16._0_4_ * fVar1)),ZEXT416((uint)fVar13),auVar15);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * fVar13)),auVar14,auVar15);
  auVar15 = vinsertps_avx(auVar10,auVar15,0x10);
  PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar15._0_8_;
  PVar17.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
  return (Point3f)PVar17.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(const Point2f &pFilm, const Point2f &lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(pFilm.x * pFilm.x + pFilm.y * pFilm.y);
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}